

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O0

void __thiscall test_adjacency_graph_back_Test::TestBody(test_adjacency_graph_back_Test *this)

{
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  bool bVar1;
  char *pcVar2;
  reference peVar3;
  reference peVar4;
  AssertHelper local_188;
  Message local_180;
  size_t local_178;
  span<unsigned_long,_18446744073709551615UL> local_170;
  span<unsigned_long,_18446744073709551615UL> local_160;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  size_t local_130;
  span<unsigned_long,_18446744073709551615UL> local_128;
  span<unsigned_long,_18446744073709551615UL> local_118;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  int local_e8 [4];
  span<unsigned_long,_18446744073709551615UL> local_d8;
  size_type local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  int local_a8 [6];
  pair<unsigned_long,_unsigned_long> local_90;
  pair<unsigned_long,_unsigned_long> local_80;
  pair<unsigned_long,_unsigned_long> local_70;
  pair<unsigned_long,_unsigned_long> local_60;
  pair<unsigned_long,_unsigned_long> *local_50;
  undefined8 local_48;
  Adjacency_Graph<false> local_40 [8];
  Adjacency_Graph<true> graph;
  test_adjacency_graph_back_Test *this_local;
  
  local_a8[5] = 0;
  local_a8[4] = 1;
  graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_90,local_a8 + 5,local_a8 + 4)
  ;
  local_a8[3] = 2;
  local_a8[2] = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_80,local_a8 + 3,local_a8 + 2)
  ;
  local_a8[1] = 2;
  local_a8[0] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_70,local_a8 + 1,local_a8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 3;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_60,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4),(int *)&gtest_ar.message_);
  local_48 = 4;
  edge_graph._M_len = 4;
  edge_graph._M_array = &local_90;
  local_50 = &local_90;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_40,edge_graph);
  local_d8 = Disa::Adjacency_Graph<false>::back(local_40);
  local_c8 = std::span<unsigned_long,_18446744073709551615UL>::size(&local_d8);
  local_e8[0] = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c0,"graph.back().size()","2",&local_c8,local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_118 = Disa::Adjacency_Graph<false>::back(local_40);
  peVar3 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_118,0);
  local_130 = 3;
  local_128 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_130);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_128,0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_108,"graph.back()[0]","graph[3][0]",peVar3,peVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_160 = Disa::Adjacency_Graph<false>::back(local_40);
  peVar3 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_160,1);
  local_178 = 3;
  local_170 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_178);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_170,1);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_150,"graph.back()[1]","graph[3][1]",peVar3,peVar4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_40);
  return;
}

Assistant:

TEST(test_adjacency_graph, back) {
  Adjacency_Graph<false> graph({{0, 1}, {2, 1}, {2, 3}, {3, 0}});
  EXPECT_EQ(graph.back().size(), 2);
  EXPECT_EQ(graph.back()[0], graph[3][0]);
  EXPECT_EQ(graph.back()[1], graph[3][1]);
}